

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O3

void ecs_log_print(int level,char *file,int32_t line,char *fmt,__va_list_tag *valist)

{
  char *pcVar1;
  ushort *puVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  char *pcVar8;
  char *pcVar9;
  ulong uVar10;
  ushort **ppuVar11;
  long lVar12;
  undefined4 in_register_00000014;
  char cVar13;
  char *str;
  char cVar14;
  char cVar15;
  char cVar16;
  char indent [32];
  ecs_strbuf_t buff;
  char filebuff [256];
  undefined2 local_598 [16];
  ecs_strbuf_t local_578;
  char local_138 [264];
  
  if (level <= trace_level) {
    strcpy(local_138,file);
    pcVar8 = strrchr(local_138,0x2f);
    pcVar9 = pcVar8 + 1;
    if (pcVar8 == (char *)0x0) {
      pcVar9 = local_138;
    }
    pcVar9 = strrchr(pcVar9,0x2e);
    if (pcVar9 != (char *)0x0) {
      *pcVar9 = '\0';
    }
    if ((long)trace_indent < 1) {
      uVar10 = 0;
    }
    else {
      lVar12 = 0;
      do {
        local_598[lVar12] = 0x207c;
        lVar12 = lVar12 + 1;
      } while (trace_indent != lVar12);
      uVar10 = (ulong)(uint)(trace_indent * 2);
    }
    *(undefined1 *)((long)local_598 + uVar10) = 0;
    pcVar9 = ecs_vasprintf((char *)CONCAT44(in_register_00000014,line),(__va_list_tag *)fmt);
    memset(&local_578,0,0x440);
    cVar14 = *pcVar9;
    if (cVar14 != '\0') {
      bVar6 = true;
      bVar5 = false;
      bVar4 = false;
      bVar3 = false;
      cVar15 = '\0';
      pcVar8 = pcVar9;
      cVar16 = '\0';
      do {
        if (bVar5) {
LAB_00116127:
          cVar13 = cVar16;
          if ((((bVar4) || (cVar13 != '\0')) || (cVar14 != '#')) || (bVar3)) goto LAB_001162da;
          if (pcVar8[1] != '[') {
            cVar13 = '\0';
            goto LAB_0011631f;
          }
          if (pcVar8[2] == ']') {
            bVar5 = true;
            bVar6 = false;
          }
          else {
            pcVar1 = pcVar8 + 2;
            iVar7 = strncmp(pcVar1,"green]",6);
            bVar5 = true;
            if (iVar7 == 0) {
              str = "\x1b[0;32m";
            }
            else {
              iVar7 = strncmp(pcVar1,"red]",4);
              if (iVar7 == 0) {
                str = "\x1b[0;31m";
              }
              else {
                iVar7 = strncmp(pcVar1,"blue]",4);
                if (iVar7 == 0) {
                  str = "\x1b[0;34m";
                }
                else {
                  iVar7 = strncmp(pcVar1,"magenta]",8);
                  if (iVar7 == 0) {
                    str = "\x1b[0;35m";
                  }
                  else {
                    iVar7 = strncmp(pcVar1,"cyan]",5);
                    if (iVar7 == 0) {
                      str = "\x1b[0;36m";
                    }
                    else {
                      iVar7 = strncmp(pcVar1,"yellow]",7);
                      if (iVar7 == 0) {
                        str = "\x1b[0;33m";
                      }
                      else {
                        iVar7 = strncmp(pcVar1,"grey]",5);
                        if (iVar7 == 0) {
                          str = "\x1b[0;37m";
                        }
                        else {
                          iVar7 = strncmp(pcVar1,"white]",6);
                          if (iVar7 == 0) {
LAB_001165a8:
                            str = "\x1b[0;49m";
                          }
                          else {
                            iVar7 = strncmp(pcVar1,"bold]",5);
                            if (iVar7 == 0) {
                              str = "\x1b[1;49m";
                            }
                            else {
                              iVar7 = strncmp(pcVar1,"normal]",7);
                              str = "\x1b[0;49m";
                              if (iVar7 != 0) {
                                iVar7 = strncmp(pcVar1,"reset]",6);
                                if (iVar7 != 0) {
                                  bVar5 = (bool)(bVar6 ^ 1);
                                  cVar13 = '\0';
                                  goto LAB_0011631f;
                                }
                                bVar5 = false;
                                goto LAB_001165a8;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
            ecs_strbuf_appendstr(&local_578,str);
          }
          pcVar8 = pcVar8 + 1;
          do {
            pcVar1 = pcVar8 + 1;
            pcVar8 = pcVar8 + 1;
          } while (*pcVar1 != ']');
          if (!bVar6) {
            bVar5 = true;
          }
          cVar13 = '\0';
          cVar15 = ']';
        }
        else {
          lVar12 = (long)cVar14;
          if ((((bVar3) && (ppuVar11 = __ctype_b_loc(), ((*ppuVar11)[lVar12] & 0xc00) == 0)) &&
              (cVar14 != '%')) && (cVar14 != '.')) {
            ecs_strbuf_appendstr(&local_578,"\x1b[0;49m");
            bVar3 = false;
          }
          if (cVar16 == '\0') {
            if ((cVar14 == '\'') || (cVar14 == '\"')) {
              ppuVar11 = __ctype_b_loc();
              cVar13 = '\0';
              if ((cVar15 != '\\') && (((*ppuVar11)[cVar15] & 0x400) == 0)) {
                ecs_strbuf_appendstr(&local_578,"\x1b[0;36m");
                cVar13 = cVar14;
              }
            }
            else {
              cVar13 = '\0';
            }
          }
          else {
            cVar13 = cVar16;
            if (cVar15 != '\\') {
              cVar13 = '\0';
            }
            if (cVar16 != cVar14) {
              cVar13 = cVar16;
            }
          }
          ppuVar11 = __ctype_b_loc();
          puVar2 = *ppuVar11;
          if ((*(byte *)((long)puVar2 + lVar12 * 2 + 1) & 8) == 0) {
            if (cVar14 == '-') {
              cVar16 = pcVar8[1];
LAB_0011625e:
              if ((*(byte *)((long)puVar2 + (long)cVar16 * 2 + 1) & 8) != 0) goto LAB_00116265;
            }
            else {
              cVar16 = cVar15;
              if (cVar14 == '%') goto LAB_0011625e;
            }
          }
          else {
LAB_00116265:
            if ((((!bVar3) && (cVar13 == '\0')) && (!bVar4)) &&
               ((((puVar2[cVar15] & 0xc00) == 0 && (cVar15 != '.')) && (cVar15 != '_')))) {
              ecs_strbuf_appendstr(&local_578,"\x1b[0;32m");
              bVar3 = true;
            }
          }
          if (((bVar4) && (((*ppuVar11)[lVar12] >> 10 & 1) == 0)) &&
             ((cVar14 != '_' && (((*ppuVar11)[lVar12] & 0x800) == 0)))) {
            ecs_strbuf_appendstr(&local_578,"\x1b[0;49m");
            bVar4 = false;
          }
          if (cVar13 == '\0') {
            cVar16 = '\0';
            if ((cVar14 != '$') || (bVar4)) goto LAB_00116127;
            if ((*(byte *)((long)*ppuVar11 + (long)pcVar8[1] * 2 + 1) & 4) != 0) {
              ecs_strbuf_appendstr(&local_578,"\x1b[0;36m");
              bVar4 = true;
            }
          }
LAB_001162da:
          if ((cVar14 == '\n') && (((bVar3 || bVar4) || cVar13 != '\0' || (bVar5)))) {
            ecs_strbuf_appendstr(&local_578,"\x1b[0;49m");
            bVar5 = false;
            bVar4 = false;
            cVar13 = '\0';
            bVar3 = false;
          }
LAB_0011631f:
          ecs_strbuf_appendstrn(&local_578,pcVar8,1);
          cVar15 = cVar14;
        }
        if (((!bVar5) && (cVar15 == '\'' || cVar15 == '\"')) && (cVar13 == '\0')) {
          ecs_strbuf_appendstr(&local_578,"\x1b[0;49m");
        }
        cVar14 = pcVar8[1];
        pcVar8 = pcVar8 + 1;
        cVar16 = cVar13;
      } while (cVar14 != '\0');
      if ((((bVar3) || (cVar13 != '\0')) || (bVar4)) || (bVar5)) {
        ecs_strbuf_appendstr(&local_578,"\x1b[0;49m");
      }
    }
    pcVar8 = ecs_strbuf_get(&local_578);
    if (level < 0) {
      if (level != -1) {
        if (level == -2) {
          ecs_os_warn("%swarn%s: %s%s%s%s","\x1b[0;33m","\x1b[0;49m","\x1b[0;37m",local_598,
                      "\x1b[0;49m",pcVar8);
        }
        else {
          ecs_os_err("%serr %s: %s%s%s%s","\x1b[0;31m","\x1b[0;49m","\x1b[0;37m",local_598,
                     "\x1b[0;49m",pcVar8);
        }
      }
    }
    else {
      ecs_os_log("%sinfo%s: %s%s%s%s","\x1b[0;35m","\x1b[0;49m","\x1b[0;37m",local_598,"\x1b[0;49m",
                 pcVar8);
    }
    (*ecs_os_api.free_)(pcVar8);
    (*ecs_os_api.free_)(pcVar9);
  }
  return;
}

Assistant:

static
void ecs_log_print(
    int level,
    const char *file,
    int32_t line,
    const char *fmt,
    va_list valist)
{
    (void)level;
    (void)line;

    if (level > trace_level) {
        return;
    }

    /* Massage filename so it doesn't take up too much space */
    char filebuff[256];
    ecs_os_strcpy(filebuff, file);
    file = filebuff;
    char *file_ptr = strrchr(file, '/');
    if (file_ptr) {
        file = file_ptr + 1;
    }

    /* Extension is likely the same for all files */
    file_ptr = strrchr(file, '.');
    if (file_ptr) {
        *file_ptr = '\0';
    }

    char indent[32];
    int i;
    for (i = 0; i < trace_indent; i ++) {
        indent[i * 2] = '|';
        indent[i * 2 + 1] = ' ';
    }
    indent[i * 2] = '\0';

    char *msg = ecs_vasprintf(fmt, valist);
    char *color_msg = ecs_colorize(msg);

    if (level >= 0) {
        ecs_os_log("%sinfo%s: %s%s%s%s",
            ECS_MAGENTA, ECS_NORMAL, ECS_GREY, indent, ECS_NORMAL, color_msg);
    } else if (level == -2) {
        ecs_os_warn("%swarn%s: %s%s%s%s",
            ECS_YELLOW, ECS_NORMAL, ECS_GREY, indent, ECS_NORMAL, color_msg);
    } else if (level <= -2) {
        ecs_os_err("%serr %s: %s%s%s%s",
            ECS_RED, ECS_NORMAL, ECS_GREY, indent, ECS_NORMAL, color_msg);
    }

    ecs_os_free(color_msg);
    ecs_os_free(msg);
}